

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_intervals.h
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
Gudhi::Persistence_representations::Persistence_intervals::cumulative_histogram_of_lengths
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          Persistence_intervals *this,size_t number_of_bins)

{
  size_type sVar1;
  reference pvVar2;
  size_type local_60;
  size_t i;
  size_t sum;
  allocator<unsigned_long> local_3a;
  undefined1 local_39;
  undefined1 local_38 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> histogram;
  size_t number_of_bins_local;
  Persistence_intervals *this_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *result;
  
  histogram.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)number_of_bins;
  histogram_of_lengths
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,this,number_of_bins);
  local_39 = 0;
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
  std::allocator<unsigned_long>::allocator(&local_3a);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,sVar1,&local_3a);
  std::allocator<unsigned_long>::~allocator(&local_3a);
  i = 0;
  for (local_60 = 0;
      sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38),
      local_60 != sVar1; local_60 = local_60 + 1) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,local_60);
    i = *pvVar2 + i;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (__return_storage_ptr__,local_60);
    *pvVar2 = i;
  }
  local_39 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<size_t> Persistence_intervals::cumulative_histogram_of_lengths(size_t number_of_bins) const {
  std::vector<size_t> histogram = this->histogram_of_lengths(number_of_bins);
  std::vector<size_t> result(histogram.size());

  size_t sum = 0;
  for (size_t i = 0; i != histogram.size(); ++i) {
    sum += histogram[i];
    result[i] = sum;
  }
  return result;
}